

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_generator_generate_blinded
              (secp256k1_context *ctx,secp256k1_generator *gen,uchar *key32,uchar *blind32)

{
  int iVar1;
  
  if (gen == (secp256k1_generator *)0x0) {
    secp256k1_generator_generate_blinded_cold_4();
  }
  else if (key32 == (uchar *)0x0) {
    secp256k1_generator_generate_blinded_cold_3();
  }
  else if (blind32 == (uchar *)0x0) {
    secp256k1_generator_generate_blinded_cold_2();
  }
  else {
    if ((ctx->ecmult_gen_ctx).built != 0) {
      iVar1 = secp256k1_generator_generate_internal(ctx,gen,key32,blind32);
      return iVar1;
    }
    secp256k1_generator_generate_blinded_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_generator_generate_blinded(const secp256k1_context* ctx, secp256k1_generator* gen, const unsigned char *key32, const unsigned char *blind32) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(gen != NULL);
    ARG_CHECK(key32 != NULL);
    ARG_CHECK(blind32 != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    return secp256k1_generator_generate_internal(ctx, gen, key32, blind32);
}